

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alg.h
# Opt level: O0

void Minisat::copy<int>(vec<int,_int> *from,vec<int,_int> *to,bool append)

{
  Size SVar1;
  int *from_00;
  int *to_00;
  undefined4 local_20;
  int i;
  bool append_local;
  vec<int,_int> *to_local;
  vec<int,_int> *from_local;
  
  if (!append) {
    vec<int,_int>::clear(to,false);
  }
  local_20 = 0;
  while( true ) {
    SVar1 = vec<int,_int>::size(from);
    if (SVar1 <= local_20) break;
    vec<int,_int>::push(to);
    from_00 = vec<int,_int>::operator[](from,local_20);
    to_00 = vec<int,_int>::last(to);
    copy<int>(from_00,to_00);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

static inline void copy(const vec<T>& from, vec<T>& to, bool append = false)
{
    if (!append)
        to.clear();
    for (int i = 0; i < from.size(); i++){
        to.push();
        copy(from[i], to.last());
    }
}